

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

void __thiscall
XPMP2::SoundFile::SoundFile
          (SoundFile *this,SoundSystem *_pSndSys,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  pointer pcVar1;
  
  this->_vptr_SoundFile = (_func_int **)&PTR__SoundFile_002dd7c8;
  this->pSndSys = _pSndSys;
  (this->filePath)._M_dataplus._M_p = (pointer)&(this->filePath).field_2;
  pcVar1 = (_filePath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filePath,pcVar1,pcVar1 + _filePath->_M_string_length);
  this->bLoop = _bLoop;
  this->coneDir = _coneDir;
  this->conePitch = _conePitch;
  this->coneInAngle = _coneInAngle;
  this->coneOutAngle = _coneOutAngle;
  this->coneOutVol = _coneOutVol;
  return;
}

Assistant:

SoundFile::SoundFile (SoundSystem* _pSndSys,
                      const std::string& _filePath, bool _bLoop,
                      float _coneDir, float _conePitch,
                      float _coneInAngle, float _coneOutAngle, float _coneOutVol) :
    pSndSys(_pSndSys), filePath(_filePath), bLoop(_bLoop),
    coneDir(_coneDir), conePitch(_conePitch),
    coneInAngle(_coneInAngle), coneOutAngle(_coneOutAngle), coneOutVol(_coneOutVol)
{}